

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

level_info_t * __thiscall
FMapInfoParser::ParseMapHeader(FMapInfoParser *this,level_info_t *defaultinfo)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  FString *pFVar7;
  level_info_t *this_00;
  char *pcVar8;
  FName mapname;
  char maptemp [8];
  
  mapname.Index = 0;
  bVar3 = FScanner::CheckNumber(&this->sc);
  if (bVar3) {
    mysnprintf(maptemp,8,"MAP%02d",(ulong)(uint)(this->sc).Number);
    FName::operator=(&mapname,maptemp);
    this->HexenHack = true;
  }
  else {
    FScanner::MustGetString(&this->sc);
    FName::operator=(&mapname,(this->sc).String);
  }
  uVar4 = FindWadLevelInfo(FName::NameData.NameArray[mapname.Index].Text);
  if (uVar4 == 0xffffffff) {
    uVar4 = TArray<level_info_t,_level_info_t>::Reserve(&wadlevelinfos,1);
  }
  this_00 = wadlevelinfos.Array + (int)uVar4;
  level_info_t::operator=(this_00,defaultinfo);
  if (this->HexenHack == true) {
    this_00->WallVertLight = '\0';
    this_00->WallHorizLight = '\0';
    uVar2._0_4_ = this_00->flags;
    uVar2._4_4_ = this_00->flags2;
    this_00->flags = (int)(uVar2 | 0x81011000081801);
    this_00->flags2 = (int)((uVar2 | 0x81011000081801) >> 0x20);
  }
  pFVar7 = &this_00->MapName;
  FString::operator=(pFVar7,FName::NameData.NameArray[mapname.Index].Text);
  FString::ToUpper(pFVar7);
  FScanner::MustGetString(&this->sc);
  pcVar8 = (this->sc).String;
  if (*pcVar8 == '$') {
    pbVar1 = (byte *)((long)&this_00->flags + 3);
    *pbVar1 = *pbVar1 | 4;
    pcVar8 = pcVar8 + 1;
  }
  else {
    bVar3 = FScanner::Compare(&this->sc,"lookup");
    if (bVar3) {
      FScanner::MustGetString(&this->sc);
      pbVar1 = (byte *)((long)&this_00->flags + 3);
      *pbVar1 = *pbVar1 | 4;
    }
    pcVar8 = (this->sc).String;
  }
  FString::operator=(&this_00->LevelName,pcVar8);
  pcVar8 = pFVar7->Chars;
  iVar5 = strncasecmp(pcVar8,"MAP",3);
  if ((iVar5 == 0) && (sVar6 = strlen(pcVar8), sVar6 < 6)) {
    iVar5 = atoi(pcVar8 + 3);
    if (0xffffff9c < iVar5 - 100U) goto LAB_0045e14b;
  }
  else if ((*pcVar8 == 'E') &&
          ((((byte)(pcVar8[1] - 0x30U) < 10 && (pcVar8[2] == 'M')) &&
           ((byte)(pcVar8[3] - 0x30U) < 10)))) {
    iVar5 = pcVar8[1] * 10 + (uint)(byte)(pcVar8[3] - 0x30U) + -0x1ea;
    goto LAB_0045e14b;
  }
  iVar5 = 0;
LAB_0045e14b:
  this_00->levelnum = iVar5;
  pFVar7 = TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::CheckKey(&HexenMusic,iVar5)
  ;
  if (pFVar7 != (FString *)0x0) {
    FString::operator=(&this_00->Music,pFVar7);
  }
  return this_00;
}

Assistant:

level_info_t *FMapInfoParser::ParseMapHeader(level_info_t &defaultinfo)
{
	FName mapname;

	if (sc.CheckNumber())
	{	// MAPNAME is a number; assume a Hexen wad
		char maptemp[8];
		mysnprintf (maptemp, countof(maptemp), "MAP%02d", sc.Number);
		mapname = maptemp;
		HexenHack = true;
	}
	else 
	{
		sc.MustGetString();
		mapname = sc.String;
	}
	int levelindex = FindWadLevelInfo (mapname);
	if (levelindex == -1)
	{
		levelindex = wadlevelinfos.Reserve(1);
	}
	level_info_t *levelinfo = &wadlevelinfos[levelindex];
	*levelinfo = defaultinfo;
	if (HexenHack)
	{
		levelinfo->WallHorizLight = levelinfo->WallVertLight = 0;

		// Hexen levels are automatically nointermission,
		// no auto sound sequences, falling damage,
		// monsters activate their own specials, and missiles
		// are always the activators of impact lines.
		levelinfo->flags |= LEVEL_NOINTERMISSION
						 | LEVEL_SNDSEQTOTALCTRL
						 | LEVEL_FALLDMG_HX
						 | LEVEL_ACTOWNSPECIAL;
		levelinfo->flags2|= LEVEL2_HEXENHACK
						 | LEVEL2_INFINITE_FLIGHT
						 | LEVEL2_MISSILESACTIVATEIMPACT
						 | LEVEL2_MONSTERFALLINGDAMAGE;

	}

	levelinfo->MapName = mapname;
	levelinfo->MapName.ToUpper();
	sc.MustGetString ();
	if (sc.String[0] == '$')
	{
		// For consistency with other definitions allow $Stringtablename here, too.
		levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		levelinfo->LevelName = sc.String + 1;
	}
	else
	{
		if (sc.Compare ("lookup"))
		{
			sc.MustGetString ();
			levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		}
		levelinfo->LevelName = sc.String;
	}

	// Set up levelnum now so that you can use Teleport_NewMap specials
	// to teleport to maps with standard names without needing a levelnum.
	levelinfo->levelnum = GetDefaultLevelNum(levelinfo->MapName);

	// Does this map have a song defined via SNDINFO's $map command?
	// Set that as this map's default music if it does.
	FString *song;
	if ((song = HexenMusic.CheckKey(levelinfo->levelnum)) != NULL)
	{
		levelinfo->Music = *song;
	}

	return levelinfo;
}